

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_Contains_Test::testBody(TEST_SimpleString_Contains_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  undefined1 local_80 [8];
  SimpleString notPartOfString;
  SimpleString mid;
  SimpleString end;
  SimpleString beginning;
  undefined1 local_30 [8];
  SimpleString empty;
  SimpleString s;
  TEST_SimpleString_Contains_Test *this_local;
  
  SimpleString::SimpleString((SimpleString *)&empty.bufferSize_,"hello!");
  SimpleString::SimpleString((SimpleString *)local_30,"");
  SimpleString::SimpleString((SimpleString *)&end.bufferSize_,"hello");
  SimpleString::SimpleString((SimpleString *)&mid.bufferSize_,"lo!");
  SimpleString::SimpleString((SimpleString *)&notPartOfString.bufferSize_,"l");
  SimpleString::SimpleString((SimpleString *)local_80,"xxxx");
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains((SimpleString *)&empty.bufferSize_,(SimpleString *)local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(empty)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x156,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains
                    ((SimpleString *)&empty.bufferSize_,(SimpleString *)&end.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(beginning)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x157,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains
                    ((SimpleString *)&empty.bufferSize_,(SimpleString *)&mid.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(end)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x158,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains
                    ((SimpleString *)&empty.bufferSize_,(SimpleString *)&notPartOfString.bufferSize_
                    );
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","s.contains(mid)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x159,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains((SimpleString *)&empty.bufferSize_,(SimpleString *)local_80);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!s.contains(notPartOfString)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15a,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains((SimpleString *)local_30,(SimpleString *)local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","empty.contains(empty)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15c,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = SimpleString::contains((SimpleString *)local_30,(SimpleString *)&empty.bufferSize_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!empty.contains(s)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x15d,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_80);
  SimpleString::~SimpleString((SimpleString *)&notPartOfString.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)&mid.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)&end.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&empty.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, Contains)
{
    SimpleString s("hello!");
    SimpleString empty("");
    SimpleString beginning("hello");
    SimpleString end("lo!");
    SimpleString mid("l");
    SimpleString notPartOfString("xxxx");

    CHECK(s.contains(empty));
    CHECK(s.contains(beginning));
    CHECK(s.contains(end));
    CHECK(s.contains(mid));
    CHECK(!s.contains(notPartOfString));

    CHECK(empty.contains(empty));
    CHECK(!empty.contains(s));
}